

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void PrintEnterBlock(ExpressionGraphContext *ctx,char *name)

{
  char *name_local;
  ExpressionGraphContext *ctx_local;
  
  PrintIndent(ctx);
  OutputContext::Print(ctx->output,name);
  OutputContext::Print(ctx->output,"{\n");
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ExpressionGraphContext &ctx, const char *name)
{
	PrintIndent(ctx);

	ctx.output.Print(name);
	ctx.output.Print("{\n");

	ctx.depth++;
}